

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmEmulator.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  byte bVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ostream *poVar9;
  RAM *this;
  GEN_Register *this_00;
  SFLAG_Register *this_01;
  reference pvVar10;
  string local_500;
  string local_4e0;
  string local_4c0;
  string local_4a0;
  string local_480;
  string local_460;
  allocator<char> local_439;
  string local_438;
  allocator<char> local_411;
  string local_410;
  allocator<char> local_3e9;
  string local_3e8;
  allocator<char> local_3c1;
  string local_3c0;
  allocator<char> local_399;
  string local_398;
  allocator<char> local_371;
  string local_370;
  allocator<char> local_349;
  string local_348;
  allocator<char> local_321;
  string local_320;
  allocator<char> local_2f9;
  string local_2f8;
  allocator<char> local_2d1;
  string local_2d0;
  allocator<char> local_2a9;
  string local_2a8;
  allocator<char> local_281;
  string local_280;
  allocator<char> local_259;
  string local_258;
  allocator<char> local_231;
  string local_230;
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  allocator<char> local_1b9;
  string local_1b8;
  allocator<char> local_191;
  string local_190;
  allocator<char> local_169;
  string local_168;
  allocator<char> local_141;
  string local_140;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  int local_7c;
  int local_78;
  int j;
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  splitCommand;
  string cmdHolder;
  SFLAG_Register *sflag;
  GEN_Register *gen;
  RAM *ram;
  
  poVar9 = std::operator<<((ostream *)&std::cout,"AsmEmulator v0.1");
  std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  poVar9 = std::operator<<((ostream *)&std::cout,"Initializing RAMDISK.");
  std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  this = (RAM *)operator_new(1);
  RAM::RAM(this);
  this_00 = (GEN_Register *)operator_new(1);
  GEN_Register::GEN_Register(this_00);
  this_01 = (SFLAG_Register *)operator_new(0x20);
  SFLAG_Register::SFLAG_Register(this_01);
  std::__cxx11::string::string
            ((string *)
             &splitCommand.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  do {
    std::__cxx11::string::operator=
              ((string *)
               &splitCommand.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,"");
    std::operator<<((ostream *)&std::cout,"> ");
    do {
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&std::cin,
                 (string *)
                 &splitCommand.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &splitCommand.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,"");
    } while (bVar1);
    StringHelpers::split
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&i,(string *)
                     &splitCommand.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,' ');
    pvVar10 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&i,0);
    bVar1 = std::operator==(pvVar10,"exit");
    if (bVar1) {
      j = 3;
    }
    else {
      pvVar10 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&i,0);
      bVar1 = std::operator==(pvVar10,"dumpmem");
      if (bVar1) {
        for (local_78 = 0; local_78 < 0x14; local_78 = local_78 + 1) {
          for (local_7c = 0; local_7c < 0x32; local_7c = local_7c + 1) {
            bVar2 = RAM::read8Bits(this,(long)(local_7c + local_78 * 0x14));
            printf("%X ",(ulong)bVar2);
          }
          std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
        }
      }
      else {
        pvVar10 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&i,0);
        bVar1 = std::operator==(pvVar10,"dumpgenregs");
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"AL",&local_a1);
          bVar2 = GEN_Register::getReg_8(this_00,&local_a0);
          printf("AL: %X\n",(ulong)bVar2);
          std::__cxx11::string::~string((string *)&local_a0);
          std::allocator<char>::~allocator(&local_a1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"AH",&local_c9);
          bVar2 = GEN_Register::getReg_8(this_00,&local_c8);
          printf("AH: %X\n",(ulong)bVar2);
          std::__cxx11::string::~string((string *)&local_c8);
          std::allocator<char>::~allocator(&local_c9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"AX",&local_f1);
          uVar3 = GEN_Register::getReg_16(this_00,&local_f0);
          printf("AX: %X\n",(ulong)uVar3);
          std::__cxx11::string::~string((string *)&local_f0);
          std::allocator<char>::~allocator(&local_f1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"EAX",&local_119);
          uVar4 = GEN_Register::getReg_32(this_00,&local_118);
          printf("EAX: %X\n",(ulong)uVar4);
          std::__cxx11::string::~string((string *)&local_118);
          std::allocator<char>::~allocator(&local_119);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"DL",&local_141);
          bVar2 = GEN_Register::getReg_8(this_00,&local_140);
          printf("DL: %X\n",(ulong)bVar2);
          std::__cxx11::string::~string((string *)&local_140);
          std::allocator<char>::~allocator(&local_141);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"DH",&local_169);
          bVar2 = GEN_Register::getReg_8(this_00,&local_168);
          printf("DH: %X\n",(ulong)bVar2);
          std::__cxx11::string::~string((string *)&local_168);
          std::allocator<char>::~allocator(&local_169);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"DX",&local_191);
          uVar3 = GEN_Register::getReg_16(this_00,&local_190);
          printf("DX: %X\n",(ulong)uVar3);
          std::__cxx11::string::~string((string *)&local_190);
          std::allocator<char>::~allocator(&local_191);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"EDX",&local_1b9);
          uVar4 = GEN_Register::getReg_32(this_00,&local_1b8);
          printf("EDX: %X\n",(ulong)uVar4);
          std::__cxx11::string::~string((string *)&local_1b8);
          std::allocator<char>::~allocator(&local_1b9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"CL",&local_1e1);
          bVar2 = GEN_Register::getReg_8(this_00,&local_1e0);
          printf("CL: %X\n",(ulong)bVar2);
          std::__cxx11::string::~string((string *)&local_1e0);
          std::allocator<char>::~allocator(&local_1e1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"CH",&local_209);
          bVar2 = GEN_Register::getReg_8(this_00,&local_208);
          printf("CH: %X\n",(ulong)bVar2);
          std::__cxx11::string::~string((string *)&local_208);
          std::allocator<char>::~allocator(&local_209);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"CX",&local_231);
          uVar3 = GEN_Register::getReg_16(this_00,&local_230);
          printf("CX: %X\n",(ulong)uVar3);
          std::__cxx11::string::~string((string *)&local_230);
          std::allocator<char>::~allocator(&local_231);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"ECX",&local_259);
          uVar4 = GEN_Register::getReg_32(this_00,&local_258);
          printf("ECX: %X\n",(ulong)uVar4);
          std::__cxx11::string::~string((string *)&local_258);
          std::allocator<char>::~allocator(&local_259);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,"BL",&local_281);
          bVar2 = GEN_Register::getReg_8(this_00,&local_280);
          printf("BL: %X\n",(ulong)bVar2);
          std::__cxx11::string::~string((string *)&local_280);
          std::allocator<char>::~allocator(&local_281);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"BH",&local_2a9);
          bVar2 = GEN_Register::getReg_8(this_00,&local_2a8);
          printf("BH: %X\n",(ulong)bVar2);
          std::__cxx11::string::~string((string *)&local_2a8);
          std::allocator<char>::~allocator(&local_2a9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"BX",&local_2d1);
          uVar3 = GEN_Register::getReg_16(this_00,&local_2d0);
          printf("BX: %X\n",(ulong)uVar3);
          std::__cxx11::string::~string((string *)&local_2d0);
          std::allocator<char>::~allocator(&local_2d1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,"EBX",&local_2f9);
          uVar4 = GEN_Register::getReg_32(this_00,&local_2f8);
          printf("EBX: %X\n",(ulong)uVar4);
          std::__cxx11::string::~string((string *)&local_2f8);
          std::allocator<char>::~allocator(&local_2f9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_320,"BP",&local_321);
          uVar3 = GEN_Register::getReg_16(this_00,&local_320);
          printf("BP: %X\n",(ulong)uVar3);
          std::__cxx11::string::~string((string *)&local_320);
          std::allocator<char>::~allocator(&local_321);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"EBP",&local_349);
          uVar4 = GEN_Register::getReg_32(this_00,&local_348);
          printf("EBP: %X\n",(ulong)uVar4);
          std::__cxx11::string::~string((string *)&local_348);
          std::allocator<char>::~allocator(&local_349);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"SI",&local_371);
          uVar3 = GEN_Register::getReg_16(this_00,&local_370);
          printf("SI: %X\n",(ulong)uVar3);
          std::__cxx11::string::~string((string *)&local_370);
          std::allocator<char>::~allocator(&local_371);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_398,"ESI",&local_399);
          uVar4 = GEN_Register::getReg_32(this_00,&local_398);
          printf("ESI: %X\n",(ulong)uVar4);
          std::__cxx11::string::~string((string *)&local_398);
          std::allocator<char>::~allocator(&local_399);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c0,"DI",&local_3c1);
          uVar3 = GEN_Register::getReg_16(this_00,&local_3c0);
          printf("DI: %X\n",(ulong)uVar3);
          std::__cxx11::string::~string((string *)&local_3c0);
          std::allocator<char>::~allocator(&local_3c1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e8,"EDI",&local_3e9);
          uVar4 = GEN_Register::getReg_32(this_00,&local_3e8);
          printf("EDI: %X\n",(ulong)uVar4);
          std::__cxx11::string::~string((string *)&local_3e8);
          std::allocator<char>::~allocator(&local_3e9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_410,"SP",&local_411);
          uVar3 = GEN_Register::getReg_16(this_00,&local_410);
          printf("SP: %X\n",(ulong)uVar3);
          std::__cxx11::string::~string((string *)&local_410);
          std::allocator<char>::~allocator(&local_411);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_438,"ESP",&local_439);
          uVar4 = GEN_Register::getReg_32(this_00,&local_438);
          printf("ESP: %X\n",(ulong)uVar4);
          std::__cxx11::string::~string((string *)&local_438);
          std::allocator<char>::~allocator(&local_439);
        }
        else {
          pvVar10 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&i,0);
          bVar1 = std::operator==(pvVar10,"setgenreg");
          if (bVar1) {
            pvVar10 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&i,1);
            bVar1 = std::operator==(pvVar10,"8");
            if (bVar1) {
              pvVar10 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&i,2);
              std::__cxx11::string::string((string *)&local_460,(string *)pvVar10);
              pvVar10 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&i,3);
              std::__cxx11::string::string((string *)&local_480,(string *)pvVar10);
              iVar5 = StringHelpers::stringToNumber(&local_480);
              GEN_Register::setReg_8(this_00,&local_460,(uint8_t)iVar5);
              std::__cxx11::string::~string((string *)&local_480);
              std::__cxx11::string::~string((string *)&local_460);
            }
          }
          else {
            pvVar10 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&i,0);
            bVar1 = std::operator==(pvVar10,"writemem-8i");
            if (bVar1) {
              pvVar10 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&i,1);
              std::__cxx11::string::string((string *)&local_4a0,(string *)pvVar10);
              iVar5 = StringHelpers::stringToNumber(&local_4a0);
              pvVar10 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&i,2);
              std::__cxx11::string::string((string *)&local_4c0,(string *)pvVar10);
              iVar6 = StringHelpers::stringToNumber(&local_4c0);
              RAM::write8Bits(this,(long)iVar5,(uint8_t)iVar6);
              std::__cxx11::string::~string((string *)&local_4c0);
              std::__cxx11::string::~string((string *)&local_4a0);
              pvVar10 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&i,2);
              std::__cxx11::string::string((string *)&local_4e0,(string *)pvVar10);
              uVar7 = StringHelpers::stringToNumber(&local_4e0);
              pvVar10 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&i,1);
              std::__cxx11::string::string((string *)&local_500,(string *)pvVar10);
              uVar8 = StringHelpers::stringToNumber(&local_500);
              printf("Wrote value 0x%X to memory location 0x%X.\n",(ulong)uVar7,(ulong)uVar8);
              std::__cxx11::string::~string((string *)&local_500);
              std::__cxx11::string::~string((string *)&local_4e0);
            }
            else {
              Opcodes::run(this_01,this_00,this,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&i);
            }
          }
        }
      }
      j = 0;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&i);
  } while (j == 0);
  j = 1;
  std::__cxx11::string::~string
            ((string *)
             &splitCommand.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return 0;
}

Assistant:

int main() {
    // Show startup statements.
    std::cout << "AsmEmulator v0.1" << std::endl;
    // Load in a new RAMDISK.
    std::cout << "Initializing RAMDISK." << std::endl;
    RAM *ram = new RAM();
    GEN_Register *gen = new GEN_Register();
    SFLAG_Register *sflag = new SFLAG_Register();
    //////////////////////////////////////////////////////
    // Temporary testing code - remove in final release //
    // Holder for command input.
    std::string cmdHolder;
    // Console input loop.
    while (true) {
        // Reset to an empty value.
        cmdHolder = "";
        // Get input.
        std::cout << "> ";
        while (true) {
            std::getline(std::cin, cmdHolder);
            // If we get an enter key bounce, loop back.
            if (cmdHolder == "") {
                continue;
            } else {
                break;
            }
        }
        // Split up the command into arguments.
        std::vector<std::string> splitCommand = StringHelpers::split(cmdHolder, ' ');
        // Check for exit condition.
        if (splitCommand[0] == "exit") {
            break;
        }
            // Dump the first 1000 bytes of memory.
        else if (splitCommand[0] == "dumpmem") {
            for (int i = 0; i < 20; i++) {
                for (int j = 0; j < 50; j++) {
                    printf("%X ", ram->read8Bits((i * 20) + j));
                }
                std::cout << std::endl;
            }
        }
            // Dump all values in the registry.
        else if (splitCommand[0] == "dumpgenregs") {
            printf("AL: %X\n", gen->getReg_8("AL"));
            printf("AH: %X\n", gen->getReg_8("AH"));
            printf("AX: %X\n", gen->getReg_16("AX"));
            printf("EAX: %X\n", gen->getReg_32("EAX"));

            printf("DL: %X\n", gen->getReg_8("DL"));
            printf("DH: %X\n", gen->getReg_8("DH"));
            printf("DX: %X\n", gen->getReg_16("DX"));
            printf("EDX: %X\n", gen->getReg_32("EDX"));

            printf("CL: %X\n", gen->getReg_8("CL"));
            printf("CH: %X\n", gen->getReg_8("CH"));
            printf("CX: %X\n", gen->getReg_16("CX"));
            printf("ECX: %X\n", gen->getReg_32("ECX"));

            printf("BL: %X\n", gen->getReg_8("BL"));
            printf("BH: %X\n", gen->getReg_8("BH"));
            printf("BX: %X\n", gen->getReg_16("BX"));
            printf("EBX: %X\n", gen->getReg_32("EBX"));

            printf("BP: %X\n", gen->getReg_16("BP"));
            printf("EBP: %X\n", gen->getReg_32("EBP"));

            printf("SI: %X\n", gen->getReg_16("SI"));
            printf("ESI: %X\n", gen->getReg_32("ESI"));

            printf("DI: %X\n", gen->getReg_16("DI"));
            printf("EDI: %X\n", gen->getReg_32("EDI"));

            printf("SP: %X\n", gen->getReg_16("SP"));
            printf("ESP: %X\n", gen->getReg_32("ESP"));
        } else if (splitCommand[0] == "setgenreg") {
            if (splitCommand[1] == "8") {
                gen->setReg_8(splitCommand[2], StringHelpers::stringToNumber(splitCommand[3]));
            }
        }
            // Write an 8-bit value to memory.
        else if (splitCommand[0] == "writemem-8i") {
            ram->write8Bits(StringHelpers::stringToNumber(splitCommand[1]),
                            StringHelpers::stringToNumber(splitCommand[2]));
            printf("Wrote value 0x%X to memory location 0x%X.\n", StringHelpers::stringToNumber(splitCommand[2]),
                   StringHelpers::stringToNumber(splitCommand[1]));
        }
            // Treat command as an opcode.
        else {
            Opcodes::run(*sflag, *gen, *ram, splitCommand);
        }
    }
    //////////////////////////////////////////////////////
    return 0;
}